

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.h
# Opt level: O2

void __thiscall Fl_Menu_Bar_Type::ideal_size(Fl_Menu_Bar_Type *this,int *w,int *h)

{
  Fl_Widget *pFVar1;
  int iVar2;
  int iVar3;
  Fl_Window *pFVar4;
  
  pFVar4 = Fl_Widget::window((this->super_Fl_Menu_Type).super_Fl_Widget_Type.o);
  *w = (pFVar4->super_Fl_Group).super_Fl_Widget.w_;
  pFVar1 = (this->super_Fl_Menu_Type).super_Fl_Widget_Type.o;
  iVar3 = (pFVar1->label_).size;
  iVar2 = Fl::box_dh((uint)pFVar1->box_);
  iVar2 = iVar3 + iVar2 + 4;
  iVar2 = iVar2 - iVar2 % 5;
  iVar3 = 0xf;
  if (0xf < iVar2) {
    iVar3 = iVar2;
  }
  *h = iVar3;
  return;
}

Assistant:

virtual void ideal_size(int &w, int &h) {
    w = o->window()->w();
    h = ((o->labelsize() + Fl::box_dh(o->box()) + 4) / 5) * 5;
    if (h < 15) h = 15;
  }